

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_facade(void)

{
  allocator local_61;
  string local_60 [33];
  Computer local_3f [2];
  Computer computer;
  allocator local_29;
  string local_28 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"facade",&local_29);
  print_func_begin((string *)local_28);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  facade::Computer::Computer(local_3f);
  facade::Computer::PowerOn(local_3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"facade",&local_61);
  print_func_end((string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  facade::Computer::~Computer(local_3f);
  return;
}

Assistant:

void test_facade() {
    print_func_begin("facade");
    facade::Computer computer;
    computer.PowerOn();

    print_func_end("facade");
}